

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O2

void __thiscall Color::Color(Color *this,double red,double green,double blue)

{
  int b;
  int g;
  int r;
  int local_2c;
  int local_28;
  int local_24;
  
  local_24 = (int)red;
  local_28 = (int)green;
  local_2c = (int)blue;
  clamp(this,&local_24,&local_28,&local_2c);
  this->r = (uchar)local_24;
  this->g = (uchar)local_28;
  this->b = (uchar)local_2c;
  return;
}

Assistant:

Color::Color(double red, double green, double blue) {
    int r,g,b;
    r = red;
    g = green;
    b = blue;
    clamp(r, g, b);

    this->r = r;
    this->g = g;
    this->b = b;

}